

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

String * __thiscall
Rml::Element::GetAddress_abi_cxx11_
          (String *__return_storage_ptr__,Element *this,bool include_pseudo_classes,
          bool include_parents)

{
  pointer ppVar1;
  PseudoClassMap *pPVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>
  *pseudo_class;
  pointer ppVar3;
  String address;
  String classes;
  String local_70;
  String local_50;
  
  ::std::__cxx11::string::string((string *)&address,(string *)&this->tag);
  if ((this->id)._M_string_length != 0) {
    ::std::__cxx11::string::append((char *)&address);
    ::std::__cxx11::string::append((string *)&address);
  }
  ElementStyle::GetClassNames_abi_cxx11_(&classes,&this->meta->style);
  if (classes._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)&classes);
    StringUtilities::Replace(&local_70,&local_50,' ','.');
    ::std::__cxx11::string::operator=((string *)&classes,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::append((char *)&address);
    ::std::__cxx11::string::append((string *)&address);
  }
  if (include_pseudo_classes) {
    pPVar2 = ElementStyle::GetActivePseudoClasses_abi_cxx11_(&this->meta->style);
    ppVar1 = (pPVar2->m_container).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = (pPVar2->m_container).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PseudoClassState>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      ::std::__cxx11::string::append((char *)&address);
      ::std::__cxx11::string::append((string *)&address);
    }
  }
  if ((include_parents) && (this->parent != (Element *)0x0)) {
    ::std::__cxx11::string::append((char *)&address);
    GetAddress_abi_cxx11_(&local_70,this->parent,include_pseudo_classes,true);
    ::std::operator+(__return_storage_ptr__,&address,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)address._M_dataplus._M_p == &address.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(address.field_2._M_allocated_capacity._1_7_,address.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = address.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = address._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(address.field_2._M_allocated_capacity._1_7_,address.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = address._M_string_length;
    address._M_string_length = 0;
    address.field_2._M_local_buf[0] = '\0';
    address._M_dataplus._M_p = (pointer)&address.field_2;
  }
  ::std::__cxx11::string::~string((string *)&classes);
  ::std::__cxx11::string::~string((string *)&address);
  return __return_storage_ptr__;
}

Assistant:

String Element::GetAddress(bool include_pseudo_classes, bool include_parents) const
{
	// Add the tag name onto the address.
	String address(tag);

	// Add the ID if we have one.
	if (!id.empty())
	{
		address += "#";
		address += id;
	}

	String classes = meta->style.GetClassNames();
	if (!classes.empty())
	{
		classes = StringUtilities::Replace(classes, ' ', '.');
		address += ".";
		address += classes;
	}

	if (include_pseudo_classes)
	{
		const PseudoClassMap& pseudo_classes = meta->style.GetActivePseudoClasses();
		for (auto& pseudo_class : pseudo_classes)
		{
			address += ":";
			address += pseudo_class.first;
		}
	}

	if (include_parents && parent)
	{
		address += " < ";
		return address + parent->GetAddress(include_pseudo_classes, true);
	}
	else
		return address;
}